

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_begin_titled(nk_context *ctx,char *name,char *title,nk_rect bounds,nk_flags flags)

{
  nk_rect *pnVar1;
  float fVar2;
  int iVar3;
  nk_hash hash;
  void *pvVar4;
  bool bVar5;
  float fVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  nk_size local_b8;
  undefined1 local_ac [8];
  nk_rect iter_bounds_1;
  nk_rect iter_bounds;
  nk_rect win_bounds;
  float h;
  nk_window *iter;
  int ishovered;
  int inpanel;
  nk_size name_length;
  int ret;
  int title_len;
  nk_hash title_hash;
  nk_style *style;
  nk_window *win;
  nk_flags flags_local;
  char *title_local;
  char *name_local;
  nk_context *ctx_local;
  nk_rect bounds_local;
  
  uVar9 = bounds._8_8_;
  uVar7 = bounds._0_8_;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3f36,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3f37,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3f38,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (((ctx->style).font == (nk_user_font *)0x0) ||
     (((ctx->style).font)->width == (nk_text_width_f)0x0)) {
    __assert_fail("ctx->style.font && ctx->style.font->width && \"if this triggers you forgot to add a font\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3f39,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    __assert_fail("!ctx->current && \"if this triggers you missed a `nk_end` call\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3f3a,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if ((((ctx == (nk_context *)0x0) || (ctx->current != (nk_window *)0x0)) || (title == (char *)0x0))
     || (name == (char *)0x0)) {
    bounds_local.w = 0.0;
  }
  else {
    iVar3 = nk_strlen(name);
    hash = nk_murmur_hash(name,iVar3,0x40);
    style = (nk_style *)nk_find_window(ctx,hash,name);
    if (style == (nk_style *)0x0) {
      iVar3 = nk_strlen(name);
      local_b8 = (nk_size)iVar3;
      style = (nk_style *)nk_create_window(ctx);
      if (style == (nk_style *)0x0) {
        __assert_fail("win",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x3f47,
                      "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                     );
      }
      if (style == (nk_style *)0x0) {
        return (int)0.0;
      }
      if ((flags & 0x100) == 0) {
        nk_insert_window(ctx,(nk_window *)style,NK_INSERT_BACK);
      }
      else {
        nk_insert_window(ctx,(nk_window *)style,NK_INSERT_FRONT);
      }
      nk_command_buffer_init
                ((nk_command_buffer *)&(style->button).normal.data.image,&ctx->memory,NK_CLIPPING_ON
                );
      *(nk_flags *)&style->cursor_last = flags;
      pnVar1 = (nk_rect *)((long)&style->cursor_last + 4);
      pnVar1->x = (float)(int)uVar7;
      pnVar1->y = (float)(int)((ulong)uVar7 >> 0x20);
      uVar8 = (undefined4)uVar9;
      (style->text).color.r = (char)uVar8;
      (style->text).color.g = (char)((uint)uVar8 >> 8);
      (style->text).color.b = (char)((uint)uVar8 >> 0x10);
      (style->text).color.a = (char)((uint)uVar8 >> 0x18);
      (style->text).padding.x = (float)(int)((ulong)uVar9 >> 0x20);
      *(nk_hash *)((long)&style->font + 4) = hash;
      if (0x3e < local_b8) {
        local_b8 = 0x3f;
      }
      nk_memcopy(style->cursors,name,local_b8);
      *(char *)((long)style->cursors + local_b8) = '\0';
      *(undefined8 *)((long)&(style->contextual_button).normal.data + 8) = 0;
      if (ctx->active == (nk_window *)0x0) {
        ctx->active = (nk_window *)style;
      }
    }
    else {
      *(uint *)&style->cursor_last = *(uint *)&style->cursor_last & 0xfffff800;
      *(nk_flags *)&style->cursor_last = flags | *(uint *)&style->cursor_last;
      if (((ulong)style->cursor_last & 6) == 0) {
        pnVar1 = (nk_rect *)((long)&style->cursor_last + 4);
        pnVar1->x = (float)(int)uVar7;
        pnVar1->y = (float)(int)((ulong)uVar7 >> 0x20);
        uVar8 = (undefined4)uVar9;
        (style->text).color.r = (char)uVar8;
        (style->text).color.g = (char)((uint)uVar8 >> 8);
        (style->text).color.b = (char)((uint)uVar8 >> 0x10);
        (style->text).color.a = (char)((uint)uVar8 >> 0x18);
        (style->text).padding.x = (float)(int)((ulong)uVar9 >> 0x20);
      }
      if (*(uint *)&style->font == ctx->seq) {
        __assert_fail("win->seq != ctx->seq",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x3f65,
                      "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                     );
      }
      *(uint *)&style->font = ctx->seq;
      if ((ctx->active == (nk_window *)0x0) && (((ulong)style->cursor_last & 0x2000) == 0)) {
        ctx->active = (nk_window *)style;
        ctx->end = (nk_window *)style;
      }
    }
    if (((ulong)style->cursor_last & 0x2000) == 0) {
      nk_start(ctx,(nk_window *)style);
      if ((((ulong)style->cursor_last & 0x2000) == 0) && (((ulong)style->cursor_last & 0x400) == 0))
      {
        stack0xffffffffffffff88 = style;
        fVar6 = (ctx->style).window.header.padding.y;
        fVar2 = (ctx->style).window.header.label_padding.y;
        fVar6 = fVar2 + fVar2 + fVar6 + fVar6 + ((ctx->style).font)->height;
        if (((ulong)style->cursor_last & 0x8000) == 0) {
          unique0x100003fa = *(nk_rect *)((long)&style->cursor_last + 4);
        }
        else {
          join_0x00001240_0x00001200_ =
               nk_rect(*(float *)((long)&style->cursor_last + 4),(float)style->cursor_visible,
                       (float)(style->text).color,fVar6);
        }
        iVar3 = nk_input_has_mouse_click_down_in_rect
                          (&ctx->input,NK_BUTTON_LEFT,stack0xffffffffffffff74,1);
        bVar5 = false;
        if (iVar3 != 0) {
          bVar5 = (ctx->input).mouse.buttons[0].clicked != 0;
        }
        iVar3 = nk_input_is_mouse_hovering_rect(&ctx->input,stack0xffffffffffffff74);
        if (((style != (nk_style *)ctx->active) && (iVar3 != 0)) &&
           ((ctx->input).mouse.buttons[0].down == 0)) {
          for (unique0x00012000 = *(nk_style **)&(style->menu_button).normal;
              stack0xffffffffffffff88 != (nk_style *)0x0;
              unique0x00012000 = *(nk_style **)&(stack0xffffffffffffff88->menu_button).normal) {
            if (((ulong)stack0xffffffffffffff88->cursor_last & 0x8000) == 0) {
              unique0x1000040a = *(nk_rect *)((long)&stack0xffffffffffffff88->cursor_last + 4);
            }
            else {
              join_0x00001240_0x00001200_ =
                   nk_rect(((nk_rect *)((long)&stack0xffffffffffffff88->cursor_last + 4))->x,
                           (float)stack0xffffffffffffff88->cursor_visible,
                           (float)(stack0xffffffffffffff88->text).color,fVar6);
            }
            if ((((iter_bounds_1.w <= iter_bounds.w + win_bounds.x) &&
                 (iter_bounds.w <= iter_bounds_1.w + iter_bounds.x)) &&
                ((iter_bounds_1.h <= iter_bounds.h + win_bounds.y &&
                 ((iter_bounds.h <= iter_bounds_1.h + iter_bounds.y &&
                  (((ulong)stack0xffffffffffffff88->cursor_last & 0x2000) == 0)))))) ||
               ((*(long *)((long)&(stack0xffffffffffffff88->contextual_button).normal.data + 8) != 0
                && (((((*(int *)((long)&(stack0xffffffffffffff88->contextual_button).active.data + 4
                                ) != 0 &&
                       (((ulong)stack0xffffffffffffff88->cursor_last & 0x2000) == 0)) &&
                      (*(float *)(*(long *)((long)&(stack0xffffffffffffff88->contextual_button).
                                                   normal.data + 8) + 0x4c) <=
                       *(float *)((long)&style->cursor_last + 4) + win_bounds.x)) &&
                     ((*(float *)((long)&style->cursor_last + 4) <=
                       *(float *)(*(long *)((long)&(stack0xffffffffffffff88->contextual_button).
                                                   normal.data + 8) + 0x4c) +
                       *(float *)(*(long *)((long)&(stack0xffffffffffffff88->contextual_button).
                                                   normal.data + 8) + 0x54) &&
                      (*(float *)(*(long *)((long)&(stack0xffffffffffffff88->contextual_button).
                                                   normal.data + 8) + 0x50) <=
                       iter_bounds.h + win_bounds.y)))) &&
                    (iter_bounds.h <=
                     *(float *)(*(long *)((long)&(stack0xffffffffffffff88->contextual_button).normal
                                                 .data + 8) + 0x50) +
                     *(float *)(*(long *)((long)&(stack0xffffffffffffff88->contextual_button).normal
                                                 .data + 8) + 0x58))))))) break;
          }
        }
        if (((stack0xffffffffffffff88 != (nk_style *)0x0) && (bVar5)) &&
           (style != (nk_style *)ctx->end)) {
          for (unique0x00012000 = *(nk_style **)&(style->menu_button).normal;
              stack0xffffffffffffff88 != (nk_style *)0x0;
              unique0x00012000 = *(nk_style **)&(stack0xffffffffffffff88->menu_button).normal) {
            if (((ulong)stack0xffffffffffffff88->cursor_last & 0x8000) == 0) {
              _local_ac = *(nk_rect *)((long)&stack0xffffffffffffff88->cursor_last + 4);
            }
            else {
              _local_ac = nk_rect(((nk_rect *)((long)&stack0xffffffffffffff88->cursor_last + 4))->x,
                                  (float)stack0xffffffffffffff88->cursor_visible,
                                  (float)(stack0xffffffffffffff88->text).color,fVar6);
            }
            if ((((((float)local_ac._0_4_ <= (ctx->input).mouse.pos.x) &&
                  ((ctx->input).mouse.pos.x < (float)local_ac._0_4_ + iter_bounds_1.x)) &&
                 ((float)local_ac._4_4_ <= (ctx->input).mouse.pos.y)) &&
                (((ctx->input).mouse.pos.y < (float)local_ac._4_4_ + iter_bounds_1.y &&
                 (((ulong)stack0xffffffffffffff88->cursor_last & 0x2000) == 0)))) ||
               ((((*(long *)((long)&(stack0xffffffffffffff88->contextual_button).normal.data + 8) !=
                   0 && ((*(int *)((long)&(stack0xffffffffffffff88->contextual_button).active.data +
                                  4) != 0 &&
                         (((ulong)stack0xffffffffffffff88->cursor_last & 0x2000) == 0)))) &&
                 (*(float *)(*(long *)((long)&(stack0xffffffffffffff88->contextual_button).normal.
                                              data + 8) + 0x4c) <= iter_bounds.w + win_bounds.x)) &&
                (((iter_bounds.w <=
                   *(float *)(*(long *)((long)&(stack0xffffffffffffff88->contextual_button).normal.
                                               data + 8) + 0x4c) +
                   *(float *)(*(long *)((long)&(stack0xffffffffffffff88->contextual_button).normal.
                                               data + 8) + 0x54) &&
                  (*(float *)(*(long *)((long)&(stack0xffffffffffffff88->contextual_button).normal.
                                               data + 8) + 0x50) <= iter_bounds.h + win_bounds.y))
                 && (iter_bounds.h <=
                     *(float *)(*(long *)((long)&(stack0xffffffffffffff88->contextual_button).normal
                                                 .data + 8) + 0x50) +
                     *(float *)(*(long *)((long)&(stack0xffffffffffffff88->contextual_button).normal
                                                 .data + 8) + 0x58))))))) break;
          }
        }
        if (((stack0xffffffffffffff88 == (nk_style *)0x0) ||
            (((ulong)style->cursor_last & 0x1000) != 0)) ||
           (((ulong)style->cursor_last & 0x100) == 0)) {
          if ((stack0xffffffffffffff88 == (nk_style *)0x0) && ((nk_style *)ctx->end != style)) {
            if (((ulong)style->cursor_last & 0x100) == 0) {
              nk_remove_window(ctx,(nk_window *)style);
              nk_insert_window(ctx,(nk_window *)style,NK_INSERT_BACK);
            }
            *(uint *)&style->cursor_last = *(uint *)&style->cursor_last & 0xffffefff;
            ctx->active = (nk_window *)style;
          }
          if (((nk_style *)ctx->end != style) && (((ulong)style->cursor_last & 0x100) == 0)) {
            *(uint *)&style->cursor_last = *(uint *)&style->cursor_last | 0x1000;
          }
        }
        else {
          *(uint *)&style->cursor_last = *(uint *)&style->cursor_last | 0x1000;
          *(uint *)&stack0xffffffffffffff88->cursor_last =
               *(uint *)&stack0xffffffffffffff88->cursor_last & 0xffffefff;
          ctx->active = (nk_window *)stack0xffffffffffffff88;
          if (((ulong)stack0xffffffffffffff88->cursor_last & 0x100) == 0) {
            nk_remove_window(ctx,(nk_window *)stack0xffffffffffffff88);
            nk_insert_window(ctx,(nk_window *)stack0xffffffffffffff88,NK_INSERT_BACK);
          }
        }
      }
      pvVar4 = nk_create_panel(ctx);
      (style->button).active.data.image.handle.ptr = pvVar4;
      ctx->current = (nk_window *)style;
      bounds_local.w = (float)nk_panel_begin(ctx,title,NK_PANEL_WINDOW);
      *(float **)((long)(style->button).active.data.image.handle.ptr + 0x18) =
           &(style->text).padding.y;
      *(nk_style_button **)((long)(style->button).active.data.image.handle.ptr + 0x20) =
           &style->button;
    }
    else {
      ctx->current = (nk_window *)style;
      (style->button).active.data.image.handle.ptr = (void *)0x0;
      bounds_local.w = 0.0;
    }
  }
  return (int)bounds_local.w;
}

Assistant:

NK_API int
nk_begin_titled(struct nk_context *ctx, const char *name, const char *title,
    struct nk_rect bounds, nk_flags flags)
{
    struct nk_window *win;
    struct nk_style *style;
    nk_hash title_hash;
    int title_len;
    int ret = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(title);
    NK_ASSERT(ctx->style.font && ctx->style.font->width && "if this triggers you forgot to add a font");
    NK_ASSERT(!ctx->current && "if this triggers you missed a `nk_end` call");
    if (!ctx || ctx->current || !title || !name)
        return 0;

    /* find or create window */
    style = &ctx->style;
    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) {
        /* create new window */
        nk_size name_length = (nk_size)nk_strlen(name);
        win = (struct nk_window*)nk_create_window(ctx);
        NK_ASSERT(win);
        if (!win) return 0;

        if (flags & NK_WINDOW_BACKGROUND)
            nk_insert_window(ctx, win, NK_INSERT_FRONT);
        else nk_insert_window(ctx, win, NK_INSERT_BACK);
        nk_command_buffer_init(&win->buffer, &ctx->memory, NK_CLIPPING_ON);

        win->flags = flags;
        win->bounds = bounds;
        win->name = title_hash;
        name_length = NK_MIN(name_length, NK_WINDOW_MAX_NAME-1);
        NK_MEMCPY(win->name_string, name, name_length);
        win->name_string[name_length] = 0;
        win->popup.win = 0;
        if (!ctx->active)
            ctx->active = win;
    } else {
        /* update window */
        win->flags &= ~(nk_flags)(NK_WINDOW_PRIVATE-1);
        win->flags |= flags;
        if (!(win->flags & (NK_WINDOW_MOVABLE | NK_WINDOW_SCALABLE)))
            win->bounds = bounds;
        /* If this assert triggers you either:
         *
         * I.) Have more than one window with the same name or
         * II.) You forgot to actually draw the window.
         *      More specific you did not call `nk_clear` (nk_clear will be
         *      automatically called for you if you are using one of the
         *      provided demo backends). */
        NK_ASSERT(win->seq != ctx->seq);
        win->seq = ctx->seq;
        if (!ctx->active && !(win->flags & NK_WINDOW_HIDDEN)) {
            ctx->active = win;
            ctx->end = win;
        }
    }
    if (win->flags & NK_WINDOW_HIDDEN) {
        ctx->current = win;
        win->layout = 0;
        return 0;
    } else nk_start(ctx, win);

    /* window overlapping */
    if (!(win->flags & NK_WINDOW_HIDDEN) && !(win->flags & NK_WINDOW_NO_INPUT))
    {
        int inpanel, ishovered;
        struct nk_window *iter = win;
        float h = ctx->style.font->height + 2.0f * style->window.header.padding.y +
            (2.0f * style->window.header.label_padding.y);
        struct nk_rect win_bounds = (!(win->flags & NK_WINDOW_MINIMIZED))?
            win->bounds: nk_rect(win->bounds.x, win->bounds.y, win->bounds.w, h);

        /* activate window if hovered and no other window is overlapping this window */
        inpanel = nk_input_has_mouse_click_down_in_rect(&ctx->input, NK_BUTTON_LEFT, win_bounds, nk_true);
        inpanel = inpanel && ctx->input.mouse.buttons[NK_BUTTON_LEFT].clicked;
        ishovered = nk_input_is_mouse_hovering_rect(&ctx->input, win_bounds);
        if ((win != ctx->active) && ishovered && !ctx->input.mouse.buttons[NK_BUTTON_LEFT].down) {
            iter = win->next;
            while (iter) {
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                    iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    (!(iter->flags & NK_WINDOW_HIDDEN)))
                    break;

                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win->bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        /* activate window if clicked */
        if (iter && inpanel && (win != ctx->end)) {
            iter = win->next;
            while (iter) {
                /* try to find a panel with higher priority in the same position */
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INBOX(ctx->input.mouse.pos.x, ctx->input.mouse.pos.y,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    !(iter->flags & NK_WINDOW_HIDDEN))
                    break;
                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }
        if (iter && !(win->flags & NK_WINDOW_ROM) && (win->flags & NK_WINDOW_BACKGROUND)) {
            win->flags |= (nk_flags)NK_WINDOW_ROM;
            iter->flags &= ~(nk_flags)NK_WINDOW_ROM;
            ctx->active = iter;
            if (!(iter->flags & NK_WINDOW_BACKGROUND)) {
                /* current window is active in that position so transfer to top
                 * at the highest priority in stack */
                nk_remove_window(ctx, iter);
                nk_insert_window(ctx, iter, NK_INSERT_BACK);
            }
        } else {
            if (!iter && ctx->end != win) {
                if (!(win->flags & NK_WINDOW_BACKGROUND)) {
                    /* current window is active in that position so transfer to top
                     * at the highest priority in stack */
                    nk_remove_window(ctx, win);
                    nk_insert_window(ctx, win, NK_INSERT_BACK);
                }
                win->flags &= ~(nk_flags)NK_WINDOW_ROM;
                ctx->active = win;
            }
            if (ctx->end != win && !(win->flags & NK_WINDOW_BACKGROUND))
                win->flags |= NK_WINDOW_ROM;
        }
    }
    win->layout = (struct nk_panel*)nk_create_panel(ctx);
    ctx->current = win;
    ret = nk_panel_begin(ctx, title, NK_PANEL_WINDOW);
    win->layout->offset_x = &win->scrollbar.x;
    win->layout->offset_y = &win->scrollbar.y;
    return ret;
}